

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_ReadSmallCord_Test::~IoTest_ReadSmallCord_Test
          (IoTest_ReadSmallCord_Test *this)

{
  IoTest_ReadSmallCord_Test *this_local;
  
  ~IoTest_ReadSmallCord_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(IoTest, ReadSmallCord) {
  absl::Cord source;
  source.Append("foo bar");

  absl::Cord dest;
  CordInputStream input(&source);
  EXPECT_TRUE(input.Skip(1));
  EXPECT_TRUE(input.ReadCord(&dest, source.size() - 2));

  EXPECT_EQ(absl::Cord("oo ba"), dest);
}